

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc_map.h
# Opt level: O2

bool __thiscall skiwi::reg_alloc_data::operator<(reg_alloc_data *this,reg_alloc_data *other)

{
  e_register_type eVar1;
  e_register_type eVar2;
  int iVar3;
  bool bVar4;
  
  eVar2 = this->type;
  eVar1 = other->type;
  bVar4 = SBORROW4(eVar2,eVar1);
  iVar3 = eVar2 - eVar1;
  if (eVar2 == eVar1) {
    if (eVar2 == t_local) {
      return this->local_id < other->local_id;
    }
    bVar4 = SBORROW4(this->reg,other->reg);
    iVar3 = this->reg - other->reg;
  }
  return bVar4 != iVar3 < 0;
}

Assistant:

bool operator < (const reg_alloc_data& other) const
    {
    if (type == other.type)
      {
      if (type == reg_alloc_data::t_local)
        return local_id < other.local_id;
      else
        return (int)reg < (int)other.reg;
      }
    else
      return (int)type < (int)other.type;
    }